

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::TabulatedBackgroundRMatrix::
TabulatedBackgroundRMatrix
          (TabulatedBackgroundRMatrix *this,int index,
          vector<long,_std::allocator<long>_> *boundaries,
          vector<long,_std::allocator<long>_> *interpolants,
          vector<double,_std::allocator<double>_> *energies,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *rmatrix)

{
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  fn<meta::id<std::vector<double,std::allocator<double>>>> local_48 [8];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *local_40;
  undefined1 local_37;
  
  local_37 = 1;
  local_40 = rmatrix;
  ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
  impl<std::vector<double,std::allocator<double>>,ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,ranges::iter_transform_view<ranges::ref_view<std::vector<std::complex<double>,std::allocator<std::complex<double>>>const>,ranges::indirected<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::extractReal<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&)::_lambda(auto:1_const&)_1_>>::adaptor<false>>>,ranges::transform_view<ranges::ref_view<std::vector<std::complex<double>,std::allocator<std::complex<double>>>const>,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::extractReal<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&)::_lambda(auto:1_const&)_1_>>
            (&local_78,local_48);
  local_37 = 1;
  local_40 = rmatrix;
  ranges::detail::to_container::fn<meta::id<std::vector<double,std::allocator<double>>>>::
  impl<std::vector<double,std::allocator<double>>,ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,ranges::iter_transform_view<ranges::ref_view<std::vector<std::complex<double>,std::allocator<std::complex<double>>>const>,ranges::indirected<njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::extractImaginary<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&)::_lambda(auto:1_const&)_1_>>::adaptor<false>>>,ranges::transform_view<ranges::ref_view<std::vector<std::complex<double>,std::allocator<std::complex<double>>>const>,njoy::ENDFtk::section::Type<2,151>::RMatrixLimited::TabulatedBackgroundRMatrix::extractImaginary<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&)::_lambda(auto:1_const&)_1_>>
            (&local_60,local_48);
  TabulatedBackgroundRMatrix(this,index,boundaries,interpolants,energies,&local_78,&local_60);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TabulatedBackgroundRMatrix( int index,
                            std::vector< long >&& boundaries,
                            std::vector< long >&& interpolants,
                            std::vector< double >&& energies,
                            std::vector< std::complex< double > >&& rmatrix ) :
  TabulatedBackgroundRMatrix( index,
                              std::move( boundaries ),
                              std::move( interpolants ),
                              std::move( energies ),
                              extractReal( rmatrix ),
                              extractImaginary( rmatrix ) ) {}